

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_rrrr_extract_insert(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 tmp_pos;
  TCGv_i32 tmp_width;
  int r4;
  int r3;
  int r2;
  int r1;
  uint32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,8,4);
  uVar2 = extract32(ctx->opcode,0xc,4);
  uVar3 = extract32(ctx->opcode,0x18,4);
  uVar4 = extract32(ctx->opcode,0x1c,4);
  uVar5 = extract32(ctx->opcode,0x15,3);
  ret = tcg_temp_new_i32(tcg_ctx_00);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  if (uVar5 == 0) {
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    tcg_gen_andi_i32_tricore(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],0x1f);
    tcg_gen_andi_i32_tricore(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0x1f);
    gen_insert(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar1],
               tcg_ctx_00->cpu_gpr_d[(int)uVar2],ret_00,ret);
  }
  else if (uVar5 - 2 < 2) {
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    tcg_gen_andi_i32_tricore(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],0x1f);
    tcg_gen_andi_i32_tricore(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0x1f);
    tcg_gen_add_i32(tcg_ctx_00,ret,ret,ret_00);
    tcg_gen_subfi_i32_tricore(tcg_ctx_00,ret,0x20,ret);
    tcg_gen_shl_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar1],
                    ret);
    tcg_gen_subfi_i32_tricore(tcg_ctx_00,ret_00,0x20,ret_00);
    if (uVar5 == 2) {
      tcg_gen_sar_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar4]
                      ,ret_00);
    }
    else {
      tcg_gen_shr_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar4]
                      ,ret_00);
    }
  }
  else if (uVar5 == 4) {
    tcg_gen_andi_i32_tricore(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0x1f);
    if (uVar1 == uVar2) {
      tcg_gen_rotl_i32_tricore
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar1],ret)
      ;
    }
    else {
      tcg_gen_shl_i32(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_gpr_d[(int)uVar1],ret);
      tcg_gen_subfi_i32_tricore(tcg_ctx_00,ret,0x20,ret);
      tcg_gen_shr_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[(int)uVar2],ret);
      tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar4],ret_00,ret);
    }
  }
  else {
    generate_trap(ctx,2,1);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  return;
}

Assistant:

static void decode_rrrr_extract_insert(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2, r3, r4;
    TCGv tmp_width, tmp_pos;

    r1 = MASK_OP_RRRR_S1(ctx->opcode);
    r2 = MASK_OP_RRRR_S2(ctx->opcode);
    r3 = MASK_OP_RRRR_S3(ctx->opcode);
    r4 = MASK_OP_RRRR_D(ctx->opcode);
    op2 = MASK_OP_RRRR_OP2(ctx->opcode);

    tmp_pos = tcg_temp_new(tcg_ctx);
    tmp_width = tcg_temp_new(tcg_ctx);

    switch (op2) {
    case OPC2_32_RRRR_DEXTR:
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        if (r1 == r2) {
            tcg_gen_rotl_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tmp_pos);
        } else {
            tcg_gen_shl_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r1], tmp_pos);
            tcg_gen_subfi_tl(tcg_ctx, tmp_pos, 32, tmp_pos);
            tcg_gen_shr_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r2], tmp_pos);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tmp_width, tmp_pos);
        }
        break;
    case OPC2_32_RRRR_EXTR:
    case OPC2_32_RRRR_EXTR_U:
        CHECK_REG_PAIR(r3);
        tcg_gen_andi_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r3+1], 0x1f);
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        tcg_gen_add_tl(tcg_ctx, tmp_pos, tmp_pos, tmp_width);
        tcg_gen_subfi_tl(tcg_ctx, tmp_pos, 32, tmp_pos);
        tcg_gen_shl_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tmp_pos);
        tcg_gen_subfi_tl(tcg_ctx, tmp_width, 32, tmp_width);
        if (op2 == OPC2_32_RRRR_EXTR) {
            tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r4], tmp_width);
        } else {
            tcg_gen_shr_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r4], tmp_width);
        }
        break;
    case OPC2_32_RRRR_INSERT:
        CHECK_REG_PAIR(r3);
        tcg_gen_andi_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r3+1], 0x1f);
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        gen_insert(ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], tmp_width,
                   tmp_pos);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, tmp_pos);
    tcg_temp_free(tcg_ctx, tmp_width);
}